

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ReferencedByGeometryShaderCase::iterate
          (ReferencedByGeometryShaderCase *this)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  TestLog *pTVar2;
  int iVar3;
  GLuint GVar4;
  GLenum GVar5;
  ProgramSources *pPVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<char> local_3cb;
  allocator<char> local_3ca;
  allocator<char> local_3c9;
  CallLogWrapper gl;
  GLint referenced;
  GLsizei length;
  deUint32 props [1];
  ScopedLogSection section;
  string local_338 [36];
  ContextType local_314;
  ContextType local_310;
  ContextType local_30c;
  undefined1 local_308 [8];
  GLint local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [184];
  undefined1 uStack_1c8;
  undefined7 uStack_1c7;
  undefined1 uStack_1c0;
  undefined8 uStack_1bf;
  ShaderProgram program;
  
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  renderCtx = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx;
  memset(local_280,0,0xac);
  local_280._176_8_ = (pointer)0x0;
  uStack_1c8 = 0;
  uStack_1c7 = 0;
  uStack_1c0 = 0;
  uStack_1bf = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&length,
             "${GLSL_VERSION_DECL}\nuniform highp vec4 u_position;\nvoid main (void)\n{\n\tgl_Position = u_position;\n}\n"
             ,&local_3c9);
  local_30c.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)props,(string *)&length,&local_30c);
  glu::VertexSource::VertexSource((VertexSource *)&gl,(string *)props);
  pPVar6 = glu::ProgramSources::operator<<((ProgramSources *)local_280,(ShaderSource *)&gl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,&local_3ca);
  local_310.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)&referenced,&local_2a0,&local_310);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_308,(string *)&referenced);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points) in;\nlayout(points, max_vertices=1) out;\nuniform highp vec4 u_offset;\nvoid main (void)\n{\n\tgl_Position = gl_in[0].gl_Position + u_offset;\n\tEmitVertex();\n}\n"
             ,&local_3cb);
  local_314.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_2c0,&local_2e0,&local_314);
  glu::GeometrySource::GeometrySource((GeometrySource *)&section,&local_2c0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)&section);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar6);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&referenced);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&gl.m_log);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&length);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
  glu::operator<<(((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log,&program);
  pTVar2 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_280,"UnreferencedUniform",(allocator<char> *)local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gl,"Unreferenced uniform u_position",(allocator<char> *)props);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_280,(string *)&gl);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::string::~string((string *)local_280);
  iVar3 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  length = 0;
  referenced = 0;
  props[0] = 0x9309;
  gl.m_enableLog = true;
  GVar4 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&gl,program.m_program.m_program,0x92e1,"u_position");
  local_280._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"u_position resource index: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&gl,program.m_program.m_program,0x92e1,GVar4,1,props,1,&length,&referenced);
  local_280._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Query GL_REFERENCED_BY_GEOMETRY_SHADER, got ");
  std::ostream::operator<<(poVar1,length);
  std::operator<<((ostream *)poVar1," value(s), value[0] = ");
  local_308 = (undefined1  [8])glu::getBooleanName;
  local_300 = referenced;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_308,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"query resource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x14a4);
  if ((length == 0) || (referenced != 0)) {
    local_280._0_8_ =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_280 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Error, expected GL_FALSE.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected value");
  }
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_280,"ReferencedUniform",(allocator<char> *)local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gl,"Referenced uniform u_offset",(allocator<char> *)props);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_280,(string *)&gl);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::string::~string((string *)local_280);
  iVar3 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var_00,iVar3),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  length = 0;
  referenced = 0;
  props[0] = 0x9309;
  gl.m_enableLog = true;
  GVar4 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&gl,program.m_program.m_program,0x92e1,"u_offset");
  local_280._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"u_offset resource index: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&gl,program.m_program.m_program,0x92e1,GVar4,1,props,1,&length,&referenced);
  local_280._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Query GL_REFERENCED_BY_GEOMETRY_SHADER, got ");
  std::ostream::operator<<(poVar1,length);
  std::operator<<((ostream *)poVar1," value(s), value[0] = ");
  local_308 = (undefined1  [8])glu::getBooleanName;
  local_300 = referenced;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_308,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"query resource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x14bd);
  if ((length == 0) || (referenced != 1)) {
    local_280._0_8_ =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_280 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Error, expected GL_TRUE.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected value");
  }
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

ReferencedByGeometryShaderCase::IterateResult ReferencedByGeometryShaderCase::iterate (void)
{
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	{
		static const char* const vertexSource =		"${GLSL_VERSION_DECL}\n"
													"uniform highp vec4 u_position;\n"
													"void main (void)\n"
													"{\n"
													"	gl_Position = u_position;\n"
													"}\n";
		static const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"layout(location = 0) out mediump vec4 fragColor;\n"
													"void main (void)\n"
													"{\n"
													"	fragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
													"}\n";
		static const char* const geometrySource =	"${GLSL_VERSION_DECL}\n"
													"${GLSL_EXT_GEOMETRY_SHADER}"
													"layout(points) in;\n"
													"layout(points, max_vertices=1) out;\n"
													"uniform highp vec4 u_offset;\n"
													"void main (void)\n"
													"{\n"
													"	gl_Position = gl_in[0].gl_Position + u_offset;\n"
													"	EmitVertex();\n"
													"}\n";

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::ProgramSources()
																		<< glu::VertexSource(specializeShader(vertexSource, m_context.getRenderContext().getType()))
																		<< glu::FragmentSource(specializeShader(fragmentSource, m_context.getRenderContext().getType()))
																		<< glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType())));
		m_testCtx.getLog() << program;

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "UnreferencedUniform", "Unreferenced uniform u_position");
			glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
			const deUint32				props[1]	= { GL_REFERENCED_BY_GEOMETRY_SHADER };
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			gl.enableLogging(true);

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_position");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_position resource index: " << resourcePos << tcu::TestLog::EndMessage;

			gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
			m_testCtx.getLog() << tcu::TestLog::Message << "Query GL_REFERENCED_BY_GEOMETRY_SHADER, got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced) << tcu::TestLog::EndMessage;

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

			if (length == 0 || referenced != GL_FALSE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FALSE." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected value");
			}
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "ReferencedUniform", "Referenced uniform u_offset");
			glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
			const deUint32				props[1]	= { GL_REFERENCED_BY_GEOMETRY_SHADER };
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			gl.enableLogging(true);

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_offset");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_offset resource index: " << resourcePos << tcu::TestLog::EndMessage;

			gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
			m_testCtx.getLog() << tcu::TestLog::Message << "Query GL_REFERENCED_BY_GEOMETRY_SHADER, got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced) << tcu::TestLog::EndMessage;

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

			if (length == 0 || referenced != GL_TRUE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_TRUE." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected value");
			}
		}
	}

	return STOP;
}